

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_command_buffer_push(nk_command_buffer *b,nk_command_type t,nk_size size)

{
  long lVar1;
  void *memory;
  void *unaligned;
  nk_size alignment;
  nk_command *cmd;
  nk_size size_local;
  nk_command_type t_local;
  nk_command_buffer *b_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x21ee,
                  "void *nk_command_buffer_push(struct nk_command_buffer *, enum nk_command_type, nk_size)"
                 );
  }
  if (b->base != (nk_buffer *)0x0) {
    if (b == (nk_command_buffer *)0x0) {
      b_local = (nk_command_buffer *)0x0;
    }
    else {
      b_local = (nk_command_buffer *)nk_buffer_alloc(b->base,NK_BUFFER_FRONT,size,8);
      if (b_local == (nk_command_buffer *)0x0) {
        b_local = (nk_command_buffer *)0x0;
      }
      else {
        b->last = (long)b_local - (long)(b->base->memory).ptr;
        lVar1 = (long)&b_local->base + size;
        *(nk_command_type *)&b_local->base = t;
        *(nk_size *)&b_local->clip =
             b->base->allocated + ((lVar1 + 7U & 0xfffffffffffffff8) - lVar1);
        b->end = *(nk_size *)&b_local->clip;
      }
    }
    return b_local;
  }
  __assert_fail("b->base",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x21ef,
                "void *nk_command_buffer_push(struct nk_command_buffer *, enum nk_command_type, nk_size)"
               );
}

Assistant:

NK_LIB void*
nk_command_buffer_push(struct nk_command_buffer* b,
    enum nk_command_type t, nk_size size)
{
    NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_command);
    struct nk_command *cmd;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(b->base);
    if (!b) return 0;
    cmd = (struct nk_command*)nk_buffer_alloc(b->base,NK_BUFFER_FRONT,size,align);
    if (!cmd) return 0;

    /* make sure the offset to the next command is aligned */
    b->last = (nk_size)((nk_byte*)cmd - (nk_byte*)b->base->memory.ptr);
    unaligned = (nk_byte*)cmd + size;
    memory = NK_ALIGN_PTR(unaligned, align);
    alignment = (nk_size)((nk_byte*)memory - (nk_byte*)unaligned);
#ifdef NK_ZERO_COMMAND_MEMORY
    NK_MEMSET(cmd, 0, size + alignment);
#endif

    cmd->type = t;
    cmd->next = b->base->allocated + alignment;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    cmd->userdata = b->userdata;
#endif
    b->end = cmd->next;
    return cmd;
}